

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cpp
# Opt level: O1

bool peparse::parse_resource_table
               (bounded_buffer *sectionData,uint32_t o,uint32_t virtaddr,uint32_t depth,
               resource_dir_entry *dirent,
               vector<peparse::resource,_std::allocator<peparse::resource>_> *rsrcs)

{
  bounded_buffer *pbVar1;
  uint virtaddr_00;
  bool bVar2;
  bool bVar3;
  resource_dir_entry *prVar4;
  long *plVar5;
  long lVar6;
  undefined8 *puVar7;
  ulong *puVar8;
  long lVar9;
  _func_ios_base_ptr_ios_base_ptr *f;
  _func_ios_base_ptr_ios_base_ptr *f_00;
  string *result;
  _func_ios_base_ptr_ios_base_ptr *f_01;
  _func_ios_base_ptr_ios_base_ptr *f_02;
  _func_ios_base_ptr_ios_base_ptr *f_03;
  _func_ios_base_ptr_ios_base_ptr *f_04;
  _func_ios_base_ptr_ios_base_ptr *f_05;
  _func_ios_base_ptr_ios_base_ptr *f_06;
  _func_ios_base_ptr_ios_base_ptr *f_07;
  _func_ios_base_ptr_ios_base_ptr *f_08;
  _func_ios_base_ptr_ios_base_ptr *f_09;
  _func_ios_base_ptr_ios_base_ptr *f_10;
  _func_ios_base_ptr_ios_base_ptr *f_11;
  uint32_t uVar10;
  ulong uVar11;
  uint32_t offset;
  int iVar12;
  uint32_t *out;
  resource_dir_table rdt;
  resource_dat_entry rdat;
  undefined1 local_120 [32];
  resource_dir_entry *local_100;
  uint local_f4;
  undefined1 local_f0 [32];
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 local_80;
  bounded_buffer *pbStack_78;
  uint32_t local_70;
  uint32_t local_6c;
  uint16_t local_68;
  uint16_t local_66;
  ushort local_64;
  ushort local_62;
  ulong local_60;
  uint32_t *local_58;
  uint32_t local_50;
  uint local_4c;
  uint local_48;
  uint32_t local_44;
  uint32_t local_40;
  uint32_t local_3c;
  vector<peparse::resource,_std::allocator<peparse::resource>_> *local_38;
  
  if (sectionData == (bounded_buffer *)0x0) {
    return false;
  }
  bVar2 = readDword(sectionData,o,&local_70);
  if (bVar2) {
    bVar2 = readDword(sectionData,o + 4,&local_6c);
    if (!bVar2) {
      err = 6;
      std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121ed5);
      to_string<unsigned_int>((string *)local_120,0x296,f_07);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x121009);
      local_f0._0_8_ = local_f0 + 0x10;
      puVar8 = puVar7 + 2;
      if ((ulong *)*puVar7 == puVar8) {
        local_f0._16_8_ = *puVar8;
        local_f0._24_8_ = puVar7[3];
      }
      else {
        local_f0._16_8_ = *puVar8;
        local_f0._0_8_ = (ulong *)*puVar7;
      }
      local_f0._8_8_ = puVar7[1];
      *puVar7 = puVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
      goto LAB_00110e4f;
    }
    bVar2 = readWord(sectionData,o + 8,&local_68);
    if (!bVar2) {
      err = 6;
      std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121ed5);
      to_string<unsigned_int>((string *)local_120,0x297,f_08);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x121009);
      local_f0._0_8_ = local_f0 + 0x10;
      puVar8 = puVar7 + 2;
      if ((ulong *)*puVar7 == puVar8) {
        local_f0._16_8_ = *puVar8;
        local_f0._24_8_ = puVar7[3];
      }
      else {
        local_f0._16_8_ = *puVar8;
        local_f0._0_8_ = (ulong *)*puVar7;
      }
      local_f0._8_8_ = puVar7[1];
      *puVar7 = puVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
      goto LAB_00110e4f;
    }
    bVar2 = readWord(sectionData,o + 10,&local_66);
    if (!bVar2) {
      err = 6;
      std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121ed5);
      to_string<unsigned_int>((string *)local_120,0x298,f_09);
      puVar7 = (undefined8 *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x121009);
      local_f0._0_8_ = local_f0 + 0x10;
      puVar8 = puVar7 + 2;
      if ((ulong *)*puVar7 == puVar8) {
        local_f0._16_8_ = *puVar8;
        local_f0._24_8_ = puVar7[3];
      }
      else {
        local_f0._16_8_ = *puVar8;
        local_f0._0_8_ = (ulong *)*puVar7;
      }
      local_f0._8_8_ = puVar7[1];
      *puVar7 = puVar8;
      puVar7[1] = 0;
      *(undefined1 *)(puVar7 + 2) = 0;
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
      goto LAB_00110e4f;
    }
    bVar2 = readWord(sectionData,o + 0xc,&local_64);
    if (bVar2) {
      bVar2 = readWord(sectionData,o + 0xe,&local_62);
      if (bVar2) {
        if (local_62 == 0 && local_64 == 0) {
          return true;
        }
        bVar2 = local_62 == 0 && local_64 == 0;
        if (local_62 == 0 && local_64 == 0) {
          return bVar2;
        }
        offset = o + 0x10;
        local_50 = depth + 1;
        local_f4 = 0;
        local_60 = (ulong)depth;
        local_4c = virtaddr;
        local_38 = rsrcs;
        do {
          virtaddr_00 = local_4c;
          prVar4 = dirent;
          if (dirent == (resource_dir_entry *)0x0) {
            prVar4 = (resource_dir_entry *)operator_new(0x78);
            prVar4->ID = 0;
            prVar4->RVA = 0;
            prVar4->type = 0;
            prVar4->name = 0;
            prVar4->lang = 0;
            (prVar4->type_str)._M_dataplus._M_p = (pointer)&(prVar4->type_str).field_2;
            (prVar4->type_str)._M_string_length = 0;
            (prVar4->type_str).field_2._M_local_buf[0] = '\0';
            (prVar4->name_str)._M_dataplus._M_p = (pointer)&(prVar4->name_str).field_2;
            (prVar4->name_str)._M_string_length = 0;
            (prVar4->name_str).field_2._M_local_buf[0] = '\0';
            (prVar4->lang_str)._M_dataplus._M_p = (pointer)&(prVar4->lang_str).field_2;
            (prVar4->lang_str)._M_string_length = 0;
            (prVar4->lang_str).field_2._M_local_buf[0] = '\0';
          }
          bVar3 = readDword(sectionData,offset,&prVar4->ID);
          if (bVar3) {
            out = &prVar4->RVA;
            local_100 = prVar4;
            bVar3 = readDword(sectionData,offset + 4,out);
            if (!bVar3) {
              err = 6;
              std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
              to_string<unsigned_int>((string *)local_120,0x2b4,f_00);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0,":",(string *)local_120);
              std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
LAB_001104a4:
              if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
                operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
              }
              prVar4 = local_100;
              if ((resource_dir_entry *)local_120._0_8_ != (resource_dir_entry *)(local_120 + 0x10))
              {
                operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
                prVar4 = local_100;
              }
              goto joined_r0x00110876;
            }
            offset = offset + 8;
            iVar12 = (int)local_60;
            local_58 = out;
            if (iVar12 != 0) {
              if (iVar12 == 2) {
                local_100->lang = local_100->ID;
                if (local_f4 < local_64) {
                  uVar10 = local_100->ID & 0xfffffff;
                  result = &local_100->lang_str;
                  goto LAB_001105f2;
                }
                goto LAB_00110607;
              }
              if (iVar12 == 1) {
                local_100->name = local_100->ID;
                if (local_f4 < local_64) {
                  uVar10 = local_100->ID & 0xfffffff;
                  result = &local_100->name_str;
                  goto LAB_001105f2;
                }
                goto LAB_00110607;
              }
              err = 4;
              std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
              to_string<unsigned_int>((string *)local_120,0x2e5,f_01);
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_f0,":",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_120);
              std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
              if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
                operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
              }
              if ((resource_dir_entry *)local_120._0_8_ != (resource_dir_entry *)(local_120 + 0x10))
              {
                uVar11 = local_120._16_8_ + 1;
                prVar4 = (resource_dir_entry *)local_120._0_8_;
                goto LAB_00110564;
              }
              goto LAB_00110569;
            }
            local_100->type = local_100->ID;
            if (local_f4 < local_64) {
              uVar10 = local_100->ID & 0xfffffff;
              result = &local_100->type_str;
LAB_001105f2:
              bVar3 = parse_resource_id(sectionData,uVar10,result);
              prVar4 = local_100;
              if (!bVar3) goto joined_r0x00110876;
            }
LAB_00110607:
            uVar10 = *local_58;
            if (-1 < (int)uVar10) {
              bVar3 = readDword(sectionData,uVar10,&local_48);
              if (bVar3) {
                bVar3 = readDword(sectionData,*local_58 + 4,&local_44);
                if (bVar3) {
                  bVar3 = readDword(sectionData,*local_58 + 8,&local_40);
                  if (bVar3) {
                    bVar3 = readDword(sectionData,*local_58 + 0xc,&local_3c);
                    prVar4 = local_100;
                    if (bVar3) {
                      local_f0._0_8_ = local_f0 + 0x10;
                      local_f0._8_8_ = 0;
                      local_f0._16_8_ = local_f0._16_8_ & 0xffffffffffffff00;
                      local_d0._M_p = (pointer)&local_c0;
                      local_c8 = 0;
                      local_c0._M_local_buf[0] = '\0';
                      local_b0._M_p = (pointer)&local_a0;
                      local_a8 = 0;
                      local_a0._M_local_buf[0] = '\0';
                      local_80._0_4_ = 0;
                      local_80._4_4_ = 0;
                      pbStack_78 = (bounded_buffer *)0x0;
                      local_90._0_4_ = 0;
                      local_90._4_4_ = 0;
                      uStack_88._0_4_ = 0;
                      uStack_88._4_4_ = 0;
                      std::__cxx11::string::_M_assign((string *)local_f0);
                      std::__cxx11::string::_M_assign((string *)&local_d0);
                      std::__cxx11::string::_M_assign((string *)&local_b0);
                      local_90._0_4_ = prVar4->type;
                      local_90._4_4_ = prVar4->name;
                      uStack_88._4_4_ = local_40;
                      uStack_88._0_4_ = prVar4->lang;
                      if (local_48 < virtaddr_00) {
                        pbStack_78 = splitBuffer(sectionData,0,0);
                        iVar12 = (int)local_60;
                      }
                      else {
                        pbStack_78 = splitBuffer(sectionData,local_48 - virtaddr_00,
                                                 local_44 + (local_48 - virtaddr_00));
                        iVar12 = (int)local_60;
                        if (pbStack_78 == (bounded_buffer *)0x0) {
                          pbStack_78 = splitBuffer(sectionData,0,0);
                        }
                      }
                      pbVar1 = pbStack_78;
                      prVar4 = local_100;
                      if (pbStack_78 == (bounded_buffer *)0x0) {
                        if (dirent == (resource_dir_entry *)0x0) {
                          resource_dir_entry::~resource_dir_entry(local_100);
                          iVar12 = (int)local_60;
                          operator_delete(prVar4,0x78);
                        }
                      }
                      else {
                        std::vector<peparse::resource,_std::allocator<peparse::resource>_>::
                        push_back(local_38,(value_type *)local_f0);
                      }
                      resource::~resource((resource *)local_f0);
                      if (pbVar1 == (bounded_buffer *)0x0) goto LAB_00110569;
                      goto LAB_001107ac;
                    }
                    err = 6;
                    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                    to_string<unsigned_int>((string *)local_120,0x324,f_05);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_f0,":",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_120);
                    std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
                  }
                  else {
                    err = 6;
                    std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                    to_string<unsigned_int>((string *)local_120,0x31a,f_04);
                    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_f0,":",
                                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_120);
                    std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
                  }
                }
                else {
                  err = 6;
                  std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                  to_string<unsigned_int>((string *)local_120,0x310,f_03);
                  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_f0,":",
                                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)local_120);
                  std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
                }
              }
              else {
                err = 6;
                std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
                to_string<unsigned_int>((string *)local_120,0x306,f_02);
                std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_f0,":",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_120);
                std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
              }
              goto LAB_001104a4;
            }
            bVar3 = parse_resource_table
                              (sectionData,uVar10 & 0xfffffff,virtaddr_00,local_50,local_100,
                               local_38);
            prVar4 = local_100;
            if (!bVar3) goto joined_r0x00110876;
LAB_001107ac:
            prVar4 = local_100;
            if (iVar12 == 0) {
              lVar6 = 0x20;
              lVar9 = 0x18;
LAB_001109cb:
              *(undefined8 *)((long)&local_100->ID + lVar6) = 0;
              **(undefined1 **)((long)&local_100->ID + lVar9) = 0;
            }
            else {
              if (iVar12 == 1) {
                lVar6 = 0x40;
                lVar9 = 0x38;
                goto LAB_001109cb;
              }
              if (iVar12 == 2) {
                lVar6 = 0x60;
                lVar9 = 0x58;
                goto LAB_001109cb;
              }
            }
            bVar3 = true;
            if (dirent == (resource_dir_entry *)0x0) {
              resource_dir_entry::~resource_dir_entry(local_100);
              operator_delete(prVar4,0x78);
            }
          }
          else {
            err = 6;
            std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121ed5);
            to_string<unsigned_int>((string *)local_120,0x2ab,f);
            plVar5 = (long *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x121009);
            puVar8 = (ulong *)(plVar5 + 2);
            if ((ulong *)*plVar5 == puVar8) {
              local_f0._16_8_ = *puVar8;
              local_f0._24_8_ = plVar5[3];
              local_f0._0_8_ = local_f0 + 0x10;
            }
            else {
              local_f0._16_8_ = *puVar8;
              local_f0._0_8_ = (ulong *)*plVar5;
            }
            local_f0._8_8_ = plVar5[1];
            *plVar5 = (long)puVar8;
            plVar5[1] = 0;
            *(undefined1 *)(plVar5 + 2) = 0;
            std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
            if ((undefined1 *)local_f0._0_8_ != local_f0 + 0x10) {
              operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
            }
            if ((resource_dir_entry *)local_120._0_8_ != (resource_dir_entry *)(local_120 + 0x10)) {
              operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
            }
joined_r0x00110876:
            if (dirent == (resource_dir_entry *)0x0) {
              resource_dir_entry::~resource_dir_entry(prVar4);
              uVar11 = 0x78;
LAB_00110564:
              operator_delete(prVar4,uVar11);
            }
LAB_00110569:
            bVar3 = false;
          }
          if (!bVar3) {
            return bVar2;
          }
          local_f4 = local_f4 + 1;
          bVar2 = (uint)local_62 + (uint)local_64 <= local_f4;
          if (bVar2) {
            return bVar2;
          }
        } while( true );
      }
      err = 6;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>((string *)local_120,0x29a,f_11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     ":",(string *)local_120);
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
    }
    else {
      err = 6;
      std::__cxx11::string::assign((char *)&err_loc_abi_cxx11_);
      to_string<unsigned_int>((string *)local_120,0x299,f_10);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f0,
                     ":",(string *)local_120);
      std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
    }
    if ((undefined1 *)local_f0._0_8_ == local_f0 + 0x10) goto LAB_00110e66;
  }
  else {
    err = 6;
    std::__cxx11::string::_M_replace((ulong)&err_loc_abi_cxx11_,0,DAT_001287f0,0x121ed5);
    to_string<unsigned_int>((string *)local_120,0x295,f_06);
    plVar5 = (long *)std::__cxx11::string::replace((ulong)local_120,0,(char *)0x0,0x121009);
    local_f0._0_8_ = local_f0 + 0x10;
    puVar8 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar8) {
      local_f0._16_8_ = *puVar8;
      local_f0._24_8_ = plVar5[3];
    }
    else {
      local_f0._16_8_ = *puVar8;
      local_f0._0_8_ = (ulong *)*plVar5;
    }
    local_f0._8_8_ = plVar5[1];
    *plVar5 = (long)puVar8;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    std::__cxx11::string::_M_append((char *)&err_loc_abi_cxx11_,local_f0._0_8_);
LAB_00110e4f:
    if ((undefined1 *)local_f0._0_8_ == local_f0 + 0x10) goto LAB_00110e66;
  }
  operator_delete((void *)local_f0._0_8_,local_f0._16_8_ + 1);
LAB_00110e66:
  if ((resource_dir_entry *)local_120._0_8_ != (resource_dir_entry *)(local_120 + 0x10)) {
    operator_delete((void *)local_120._0_8_,local_120._16_8_ + 1);
  }
  return false;
}

Assistant:

bool parse_resource_table(bounded_buffer *sectionData,
                          std::uint32_t o,
                          std::uint32_t virtaddr,
                          std::uint32_t depth,
                          resource_dir_entry *dirent,
                          std::vector<resource> &rsrcs) {
  resource_dir_table rdt;

  if (sectionData == nullptr) {
    return false;
  }

  READ_DWORD(sectionData, o, rdt, Characteristics);
  READ_DWORD(sectionData, o, rdt, TimeDateStamp);
  READ_WORD(sectionData, o, rdt, MajorVersion);
  READ_WORD(sectionData, o, rdt, MinorVersion);
  READ_WORD(sectionData, o, rdt, NameEntries);
  READ_WORD(sectionData, o, rdt, IDEntries);

  o += sizeof(resource_dir_table);

  if (rdt.NameEntries == 0u && rdt.IDEntries == 0u) {
    return true; // This is not a hard error. It does happen.
  }

  for (std::uint32_t i = 0;
       i < static_cast<std::uint32_t>(rdt.NameEntries + rdt.IDEntries);
       i++) {
    resource_dir_entry *rde = dirent;
    if (dirent == nullptr) {
      rde = new resource_dir_entry;
    }

    if (!readDword(sectionData, o + offsetof(__typeof__(*rde), ID), rde->ID)) {
      PE_ERR(PEERR_READ);
      if (dirent == nullptr) {
        delete rde;
      }
      return false;
    }

    if (!readDword(
            sectionData, o + offsetof(__typeof__(*rde), RVA), rde->RVA)) {
      PE_ERR(PEERR_READ);
      if (dirent == nullptr) {
        delete rde;
      }
      return false;
    }

    o += sizeof(resource_dir_entry_sz);

    if (depth == 0) {
      rde->type = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->type_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else if (depth == 1) {
      rde->name = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->name_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else if (depth == 2) {
      rde->lang = rde->ID;
      if (i < rdt.NameEntries) {
        if (!parse_resource_id(
                sectionData, rde->ID & 0x0FFFFFFF, rde->lang_str)) {
          if (dirent == nullptr) {
            delete rde;
          }
          return false;
        }
      }
    } else {
      /* .rsrc can accommodate up to 2**31 levels, but Windows only uses 3 by
       * convention. As such, any depth above 3 indicates potentially unchecked
       * recursion. See:
       * https://docs.microsoft.com/en-us/windows/desktop/debug/pe-format#the-rsrc-section
       */

      PE_ERR(PEERR_RESC);
      return false;
    }

    // High bit 0 = RVA to RDT.
    // High bit 1 = RVA to RDE.
    if (rde->RVA & 0x80000000) {
      if (!parse_resource_table(sectionData,
                                rde->RVA & 0x0FFFFFFF,
                                virtaddr,
                                depth + 1,
                                rde,
                                rsrcs)) {
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }
    } else {
      resource_dat_entry rdat;

      /*
       * This one is using rde->RVA as an offset.
       *
       * This is because we don't want to set o because we have to keep the
       * original value when we are done parsing this resource data entry.
       * We could store the original o value and reset it when we are done,
       * but meh.
       */

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), RVA),
                     rdat.RVA)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), size),
                     rdat.size)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), codepage),
                     rdat.codepage)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      if (!readDword(sectionData,
                     rde->RVA + offsetof(__typeof__(rdat), reserved),
                     rdat.reserved)) {
        PE_ERR(PEERR_READ);
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      resource rsrc;
      rsrc.type_str = rde->type_str;
      rsrc.name_str = rde->name_str;
      rsrc.lang_str = rde->lang_str;
      rsrc.type = rde->type;
      rsrc.name = rde->name;
      rsrc.lang = rde->lang;
      rsrc.codepage = rdat.codepage;
      rsrc.RVA = rdat.RVA;
      rsrc.size = rdat.size;

      // The start address is (RVA - section virtual address).
      uint32_t start = rdat.RVA - virtaddr;
      /*
       * Some binaries (particularly packed) will have invalid addresses here.
       * If those happen, return a zero length buffer.
       * If the start is valid, try to get the data and if that fails return
       * a zero length buffer.
       */
      if (start > rdat.RVA) {
        rsrc.buf = splitBuffer(sectionData, 0, 0);
      } else {
        rsrc.buf = splitBuffer(sectionData, start, start + rdat.size);
        if (rsrc.buf == nullptr) {
          rsrc.buf = splitBuffer(sectionData, 0, 0);
        }
      }

      /* If we can't get even a zero length buffer, something is very wrong. */
      if (rsrc.buf == nullptr) {
        if (dirent == nullptr) {
          delete rde;
        }
        return false;
      }

      rsrcs.push_back(rsrc);
    }

    if (depth == 0) {
      rde->type_str.clear();
    } else if (depth == 1) {
      rde->name_str.clear();
    } else if (depth == 2) {
      rde->lang_str.clear();
    }

    if (dirent == nullptr) {
      delete rde;
    }
  }

  return true;
}